

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int32 iVar3;
  uint uVar4;
  Type TVar5;
  uint32 uVar6;
  int64 iVar7;
  protobuf *ppVar8;
  char *pcVar9;
  string *src;
  long lVar10;
  EnumValueDescriptor *this_00;
  LogMessage *other;
  int i;
  uint i_00;
  long i_01;
  unsigned_long i_02;
  EnumValueDescriptor *descriptor;
  float value;
  double value_00;
  allocator local_21a;
  LogFinisher local_219;
  LogMessage local_218;
  allocator local_1d9;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  allocator local_111;
  undefined1 local_110 [8];
  string bytes;
  uint32 length;
  string *default_string;
  undefined1 local_d8 [6];
  bool has_default_value;
  string local_b8;
  string local_98;
  string local_78;
  allocator local_51;
  string local_50;
  allocator local_2d [20];
  allocator local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"nil",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(local_18);
    switch(CVar2) {
    case CPPTYPE_INT32:
      iVar3 = FieldDescriptor::default_value_int32(local_18);
      if (iVar3 == -0x80000000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"-0x80000000",local_2d);
        std::allocator<char>::~allocator((allocator<char> *)local_2d);
      }
      else {
        uVar4 = FieldDescriptor::default_value_int32(local_18);
        SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar4,i);
      }
      break;
    case CPPTYPE_INT64:
      iVar7 = FieldDescriptor::default_value_int64(local_18);
      if (iVar7 == -0x8000000000000000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"-0x8000000000000000LL",&local_51);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
      }
      else {
        ppVar8 = (protobuf *)FieldDescriptor::default_value_int64(local_18);
        SimpleItoa_abi_cxx11_(&local_78,ppVar8,i_01);
        std::operator+(__return_storage_ptr__,&local_78,"LL");
        std::__cxx11::string::~string((string *)&local_78);
      }
      break;
    case CPPTYPE_UINT32:
      uVar6 = FieldDescriptor::default_value_uint32(local_18);
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)uVar6,i_00);
      std::operator+(__return_storage_ptr__,&local_50,"U");
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case CPPTYPE_UINT64:
      ppVar8 = (protobuf *)FieldDescriptor::default_value_uint64(local_18);
      SimpleItoa_abi_cxx11_(&local_98,ppVar8,i_02);
      std::operator+(__return_storage_ptr__,&local_98,"ULL");
      std::__cxx11::string::~string((string *)&local_98);
      break;
    case CPPTYPE_DOUBLE:
      value_00 = FieldDescriptor::default_value_double(local_18);
      SimpleDtoa_abi_cxx11_(&local_b8,(protobuf *)this,value_00);
      HandleExtremeFloatingPoint(__return_storage_ptr__,&local_b8,false);
      std::__cxx11::string::~string((string *)&local_b8);
      break;
    case CPPTYPE_FLOAT:
      value = FieldDescriptor::default_value_float(local_18);
      SimpleFtoa_abi_cxx11_((string *)local_d8,(protobuf *)this,value);
      HandleExtremeFloatingPoint(__return_storage_ptr__,(string *)local_d8,true);
      std::__cxx11::string::~string((string *)local_d8);
      break;
    case CPPTYPE_BOOL:
      bVar1 = FieldDescriptor::default_value_bool(local_18);
      pcVar9 = "NO";
      if (bVar1) {
        pcVar9 = "YES";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,pcVar9,(allocator *)((long)&default_string + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&default_string + 7));
      break;
    case CPPTYPE_ENUM:
      this_00 = FieldDescriptor::default_value_enum(local_18);
      EnumValueName_abi_cxx11_(__return_storage_ptr__,(objectivec *)this_00,descriptor);
      break;
    case CPPTYPE_STRING:
      default_string._6_1_ = FieldDescriptor::has_default_value(local_18);
      src = FieldDescriptor::default_value_string_abi_cxx11_(local_18);
      if (((default_string._6_1_ & 1) == 0) ||
         (lVar10 = std::__cxx11::string::length(), lVar10 == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"nil",
                   (allocator *)(bytes.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(bytes.field_2._M_local_buf + 0xf));
      }
      else {
        TVar5 = FieldDescriptor::type(local_18);
        if (TVar5 == TYPE_BYTES) {
          uVar6 = std::__cxx11::string::length();
          bytes.field_2._8_4_ = ghtonl(uVar6);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_110,bytes.field_2._M_local_buf + 8,4,&local_111);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
          std::__cxx11::string::append((string *)local_110);
          CEscape(&local_178,(string *)local_110);
          EscapeTrigraphs(&local_158,&local_178);
          std::operator+(&local_138,"(NSData*)\"",&local_158);
          std::operator+(__return_storage_ptr__,&local_138,"\"");
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)local_110);
        }
        else {
          CEscape(&local_1d8,src);
          EscapeTrigraphs(&local_1b8,&local_1d8);
          std::operator+(&local_198,"@\"",&local_1b8);
          std::operator+(__return_storage_ptr__,&local_198,"\"");
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
        }
      }
      break;
    case CPPTYPE_MESSAGE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"nil",&local_1d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_218,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
                 ,0x327);
      other = internal::LogMessage::operator<<(&local_218,"Can\'t get here.");
      internal::LogFinisher::operator=(&local_219,other);
      internal::LogMessage::~LogMessage(&local_218);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)0x0,&local_21a);
      std::allocator<char>::~allocator((allocator<char> *)&local_21a);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  // Repeated fields don't have defaults.
  if (field->is_repeated()) {
    return "nil";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == INT_MIN) {
        return "-0x80000000";
      }
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "U";
    case FieldDescriptor::CPPTYPE_INT64:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int64() == LLONG_MIN) {
        return "-0x8000000000000000LL";
      }
      return SimpleItoa(field->default_value_int64()) + "LL";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(field->default_value_uint64()) + "ULL";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return HandleExtremeFloatingPoint(
          SimpleDtoa(field->default_value_double()), false);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return HandleExtremeFloatingPoint(
          SimpleFtoa(field->default_value_float()), true);
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "YES" : "NO";
    case FieldDescriptor::CPPTYPE_STRING: {
      const bool has_default_value = field->has_default_value();
      const string& default_string = field->default_value_string();
      if (!has_default_value || default_string.length() == 0) {
        // If the field is defined as being the empty string,
        // then we will just assign to nil, as the empty string is the
        // default for both strings and data.
        return "nil";
      }
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        // We want constant fields in our data structures so we can
        // declare them as static. To achieve this we cheat and stuff
        // a escaped c string (prefixed with a length) into the data
        // field, and cast it to an (NSData*) so it will compile.
        // The runtime library knows how to handle it.

        // Must convert to a standard byte order for packing length into
        // a cstring.
        uint32 length = ghtonl(default_string.length());
        string bytes((const char*)&length, sizeof(length));
        bytes.append(default_string);
        return "(NSData*)\"" + EscapeTrigraphs(CEscape(bytes)) + "\"";
      } else {
        return "@\"" + EscapeTrigraphs(CEscape(default_string)) + "\"";
      }
    }
    case FieldDescriptor::CPPTYPE_ENUM:
      return EnumValueName(field->default_value_enum());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "nil";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}